

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

void Llb_Nonlin4AddPartition(Llb_Mgr_t_conflict *p,int i,DdNode *bFunc)

{
  int iVar1;
  Llb_Prt_t *pLVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  if (*(int *)((ulong)bFunc & 0xfffffffffffffffe) == 0x7fffffff) {
    __assert_fail("!Cudd_IsConstant(bFunc)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                  ,0x219,"void Llb_Nonlin4AddPartition(Llb_Mgr_t *, int, DdNode *)");
  }
  pLVar2 = (Llb_Prt_t *)calloc(1,0x18);
  p->pParts[i] = pLVar2;
  pLVar2 = p->pParts[i];
  pLVar2->iPart = i;
  pLVar2->bFunc = bFunc;
  Cudd_Ref(bFunc);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0x10;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  pVVar3->pArray = piVar4;
  p->pParts[i]->vVars = pVVar3;
  Extra_SupportArray(p->dd,bFunc,p->pSupp);
  if (p->nVars < 1) {
    iVar6 = 0;
  }
  else {
    lVar5 = 0;
    iVar6 = 0;
    do {
      iVar1 = p->pSupp[lVar5];
      if (iVar1 != 0) {
        if (p->vVars2Q->nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vVars2Q->pArray[lVar5] != 0) {
          Llb_Nonlin4AddPair(p,i,(int)lVar5);
        }
      }
      iVar6 = iVar6 + iVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nVars);
  }
  if (iVar6 < p->nSuppMax) {
    iVar6 = p->nSuppMax;
  }
  p->nSuppMax = iVar6;
  return;
}

Assistant:

void Llb_Nonlin4AddPartition( Llb_Mgr_t * p, int i, DdNode * bFunc )
{
    int k, nSuppSize;
    assert( !Cudd_IsConstant(bFunc) );
//printf( "Creating init %d\n", i );
    // create partition
    p->pParts[i] = ABC_CALLOC( Llb_Prt_t, 1 );
    p->pParts[i]->iPart = i;
    p->pParts[i]->bFunc = bFunc;  Cudd_Ref( bFunc );
    p->pParts[i]->vVars = Vec_IntAlloc( 8 );
    // add support dependencies
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( k = 0; k < p->nVars; k++ )
    {
        nSuppSize += p->pSupp[k];
        if ( p->pSupp[k] && Vec_IntEntry(p->vVars2Q, k) )
            Llb_Nonlin4AddPair( p, i, k );
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
}